

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O3

bool __thiscall Clasp::WeightConstraint::integrateRoot(WeightConstraint *this,Solver *s)

{
  WL WVar1;
  WL *pWVar2;
  pointer puVar3;
  pointer pLVar4;
  uint32 uVar5;
  GenericWatch *pGVar6;
  uint uVar7;
  uint uVar8;
  uint32 i;
  uint32 uVar9;
  uint uVar10;
  int iVar11;
  
  uVar10 = (s->levels_).super_type.ebo_.size;
  if (uVar10 != 0) {
    uVar8 = *(uint *)&this->field_0x10 & 0x7ffffff;
    pWVar2 = this->lits_;
    WVar1 = *pWVar2;
    uVar7 = 0;
    if (uVar8 != (uint)WVar1 >> 0x1f) {
      uVar7 = *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                       (ulong)((uint)pWVar2[(ulong)(((uint)this->bound_[(ulong)uVar8 + 1] >> 2) <<
                                                   (WVar1._3_1_ >> 7)) + 1] & 0xfffffffc)) >> 4;
    }
    if ((uVar7 < (s->levels_).root) && ((s->conflict_).ebo_.size == 0)) {
      if (((uint)WVar1 & 0x3fffffff) == 0) {
        iVar11 = 0;
      }
      else {
        puVar3 = (s->assign_).assign_.ebo_.buf;
        iVar11 = 0;
        uVar7 = 0;
        do {
          uVar8 = *(uint *)((long)puVar3 +
                           (ulong)((uint)pWVar2[(ulong)(uVar7 << (SUB41(*pWVar2,3) >> 7)) + 1] &
                                  0xfffffffc));
          if (0xf < uVar8 && (uVar8 & 3) != 0) {
            iVar11 = iVar11 + 1;
            puVar3[(uint)pWVar2[(ulong)(uVar7 << (SUB41(*pWVar2,3) >> 7)) + 1] >> 2] = uVar8 | 0xc;
            if (uVar8 >> 4 < uVar10) {
              uVar10 = uVar8 >> 4;
            }
          }
          uVar7 = uVar7 + 1;
        } while (((uint)WVar1 & 0x3fffffff) != uVar7);
      }
      uVar9 = (s->assign_).front;
      uVar10 = *(uint *)((s->levels_).super_type.ebo_.buf + (uVar10 - 1)) & 0x3fffffff;
      if (iVar11 != 0 && uVar10 != uVar9) {
        do {
          pLVar4 = (s->assign_).trail.ebo_.buf;
          puVar3 = (s->assign_).assign_.ebo_.buf;
          uVar7 = pLVar4[uVar10].rep_;
          uVar8 = *(uint *)((long)puVar3 + (ulong)(uVar7 & 0xfffffffc));
          if (((uVar7 & 2) * 2 + 4 & uVar8) != 0) {
            iVar11 = iVar11 + -1;
            puVar3[uVar7 >> 2] = uVar8 & 0xfffffff3;
            if (((s->conflict_).ebo_.size == 0) &&
               (pGVar6 = Solver::getWatch(s,(Literal)pLVar4[uVar10].rep_,&this->super_Constraint),
               pGVar6 != (GenericWatch *)0x0)) {
              (**pGVar6->con->_vptr_Constraint)(pGVar6->con,s,(ulong)uVar7,&pGVar6->data);
            }
          }
        } while ((uVar9 - 1 != uVar10) && (uVar10 = uVar10 + 1, iVar11 != 0));
      }
      uVar5 = (s->assign_).trail.ebo_.size;
      if (iVar11 != 0 && uVar9 != uVar5) {
        pLVar4 = (s->assign_).trail.ebo_.buf;
        puVar3 = (s->assign_).assign_.ebo_.buf;
        do {
          uVar10 = pLVar4[uVar9].rep_;
          uVar7 = *(uint *)((long)puVar3 + (ulong)(uVar10 & 0xfffffffc));
          if ((uVar7 & 0xc) != 0) {
            iVar11 = iVar11 + -1;
            puVar3[uVar10 >> 2] = uVar7 & 0xfffffff3;
            uVar5 = (s->assign_).trail.ebo_.size;
          }
          uVar9 = uVar9 + 1;
        } while ((uVar9 != uVar5) && (iVar11 != 0));
      }
    }
  }
  return (s->conflict_).ebo_.size == 0;
}

Assistant:

bool WeightConstraint::integrateRoot(Solver& s) {
	if (!s.decisionLevel() || highestUndoLevel(s) >= s.rootLevel() || s.hasConflict()) { return !s.hasConflict(); }
	// check if constraint has assigned literals
	uint32 low = s.decisionLevel(), vDL;
	uint32 np  = 0;
	for (uint32 i = 0, end = size(); i != end; ++i) {
		Var v = lits_->var(i);
		if (s.value(v) != value_free && (vDL = s.level(v)) != 0) {
			++np;
			s.markSeen(v);
			low = std::min(low, vDL);
		}
	}
	// propagate assigned literals in assignment order
	const LitVec& trail = s.trail();
	const uint32  end   = sizeVec(trail) - s.queueSize();
	GenericWatch* w     = 0;
	for (uint32 i = s.levelStart(low); i != end && np; ++i) {
		Literal p = trail[i];
		if (s.seen(p) && np--) {
			s.clearSeen(p.var());
			if (!s.hasConflict() && (w = s.getWatch(trail[i], this)) != 0) {
				w->propagate(s, p);
			}
		}
	}
	for (uint32 i = end; i != trail.size() && np; ++i) {
		if (s.seen(trail[i].var())) { --np; s.clearSeen(trail[i].var()); }
	}
	return !s.hasConflict();
}